

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::GetPropertyAsBool(cmTarget *this,string *prop)

{
  bool bVar1;
  cmValue val;
  string *prop_local;
  cmTarget *this_local;
  
  val = GetProperty(this,prop);
  bVar1 = cmIsOn(val);
  return bVar1;
}

Assistant:

bool cmTarget::GetPropertyAsBool(const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}